

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Vec_Ptr_t * Bac_PtrDeriveFromCba(Bac_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *Entry;
  long lVar1;
  long lVar2;
  
  if (p != (Bac_Man_t *)0x0) {
    if (p->pMioLib != (void *)0x0) {
      Bac_ManAssignInternWordNames(p);
      p_00 = Vec_PtrAllocExact(p->nNtks + 1);
      Vec_PtrPush(p_00,p->pName);
      lVar1 = 0xd0;
      for (lVar2 = 1; lVar2 <= p->nNtks; lVar2 = lVar2 + 1) {
        Entry = Bac_NtkTransformToPtr((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar1));
        Vec_PtrPush(p_00,Entry);
        lVar1 = lVar1 + 0xd0;
      }
      Ptr_CheckArray(p_00);
      return p_00;
    }
    puts("Cannot transform CBA network into Ptr because it is not mapped.");
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Bac_PtrDeriveFromCba( Bac_Man_t * p )
{
    Vec_Ptr_t * vDes;
    Bac_Ntk_t * pTemp; int i;
    if ( p == NULL )
        return NULL;
    if ( p->pMioLib == NULL )
    {
        printf( "Cannot transform CBA network into Ptr because it is not mapped.\n" );
        return NULL;
    }
    Bac_ManAssignInternWordNames( p );
    vDes = Vec_PtrAllocExact( 1 + Bac_ManNtkNum(p) );
    Vec_PtrPush( vDes, p->pName );
    Bac_ManForEachNtk( p, pTemp, i )
        Vec_PtrPush( vDes, Bac_NtkTransformToPtr(pTemp) );
    assert( Ptr_CheckArray(vDes) );
    return vDes;
}